

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::iterate
          (TestStatus *__return_storage_ptr__,OcclusionQueryTestInstance *this)

{
  void **ppvVar1;
  void **this_00;
  OcclusionQueryResultSize OVar2;
  VkPrimitiveTopology VVar3;
  TestLog *this_01;
  StateObjects *this_02;
  Allocation *pAVar4;
  VkSemaphore *__src;
  VkDeviceSize VVar5;
  ulong uVar6;
  VkResult VVar7;
  OcclusionQueryResultsMode OVar8;
  VkQueue pVVar9;
  DeviceInterface *vk;
  VkDevice device;
  DeviceInterface *vkd;
  MessageBuilder *pMVar10;
  TestError *pTVar11;
  size_t __n;
  void *__buf;
  deUint64 *pdVar12;
  long lVar13;
  deUint64 dVar14;
  int iVar15;
  ulong uVar16;
  deUint64 *value;
  bool bVar17;
  ulong uStack_2a0;
  allocator<char> local_292;
  allocator<char> local_291;
  TestLog *local_290;
  OcclusionQueryTestInstance *local_288;
  OcclusionQueryWait local_27c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultsBuffer;
  deUint64 queryResults [3];
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_220;
  VkSubmitInfo submitInfoReset;
  deUint64 queryAvailability [3];
  string local_68;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  
  pVVar9 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  this_01 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&vertices,9,(allocator_type *)&submitInfoReset);
  (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[0] = 0.5;
  (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[1] = 0.5;
  (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.5;
  (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = -0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = -0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = -0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = -0.5;
  *(undefined1 **)
   (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data + 2) = &DAT_3f8000003f800000;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = 0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = -0.5;
  *(undefined1 **)
   (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data + 2) = &DAT_3f8000003f800000;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = -0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = 0.5;
  *(undefined1 **)
   (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data + 2) = &DAT_3f8000003f800000;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[6].m_data[0] = 0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[6].m_data[1] = 0.5;
  *(undefined1 **)
   (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[6].m_data + 2) = &DAT_3f8000003f800000;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[7].m_data[0] = 0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[7].m_data[1] = -0.5;
  *(undefined1 **)
   (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[7].m_data + 2) = &DAT_3f8000003f800000;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[8].m_data[0] = -0.5;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[8].m_data[1] = 0.5;
  *(undefined1 **)
   (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[8].m_data + 2) = &DAT_3f8000003f800000;
  this_02 = this->m_stateObjects;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_220,
             &vertices);
  StateObjects::setVertices
            (this_02,vk,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_220);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_220);
  if (((this->m_testVector).queryResultsMode != RESULTS_MODE_COPY) &&
     ((this->m_testVector).queryWait != WAIT_QUEUE)) {
    submitInfoReset.pNext = (void *)0x0;
    submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfoReset.signalSemaphoreCount = 0;
    submitInfoReset._60_4_ = 0;
    submitInfoReset.waitSemaphoreCount = 0;
    submitInfoReset._20_4_ = 0;
    submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfoReset._4_4_ = 0;
    submitInfoReset.commandBufferCount = 1;
    submitInfoReset._44_4_ = 0;
    submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_queryPoolResetCommandBuffer;
    (*vk->_vptr_DeviceInterface[2])(vk,pVVar9,1,&submitInfoReset,0);
    VVar7 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar9);
    ::vk::checkResult(VVar7,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x292);
  }
  submitInfoReset.pNext = (void *)0x0;
  submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfoReset.signalSemaphoreCount = 0;
  submitInfoReset._60_4_ = 0;
  submitInfoReset.waitSemaphoreCount = 0;
  submitInfoReset._20_4_ = 0;
  submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfoReset._4_4_ = 0;
  submitInfoReset.commandBufferCount = 1;
  submitInfoReset._44_4_ = 0;
  submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_renderCommandBuffer;
  (*vk->_vptr_DeviceInterface[2])(vk,pVVar9,1,&submitInfoReset,0);
  if ((this->m_testVector).queryWait == WAIT_QUEUE) {
    VVar7 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar9);
    ::vk::checkResult(VVar7,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2a7);
    OVar8 = (this->m_testVector).queryResultsMode;
    if ((OVar8 != RESULTS_MODE_COPY) || ((this->m_testVector).queryWait != WAIT_QUEUE))
    goto LAB_0068da05;
    submitInfoReset.pNext = (void *)0x0;
    submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfoReset.signalSemaphoreCount = 0;
    submitInfoReset._60_4_ = 0;
    submitInfoReset.waitSemaphoreCount = 0;
    submitInfoReset._20_4_ = 0;
    submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfoReset._4_4_ = 0;
    submitInfoReset.commandBufferCount = 1;
    submitInfoReset._44_4_ = 0;
    submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_copyResultsCommandBuffer;
    (*vk->_vptr_DeviceInterface[2])(vk,pVVar9,1,&submitInfoReset,0);
  }
  OVar8 = (this->m_testVector).queryResultsMode;
LAB_0068da05:
  if (OVar8 == RESULTS_MODE_COPY) {
    VVar7 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar9);
    ::vk::checkResult(VVar7,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2c5);
  }
  local_27c = (this->m_testVector).queryWait;
  device = Context::getDevice((this->super_TestInstance).m_context);
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&resultsBuffer,(this->m_testVector).queryResultsStride * 3,
             (allocator_type *)&submitInfoReset);
  OVar8 = (this->m_testVector).queryResultsMode;
  local_288 = this;
  if (OVar8 == RESULTS_MODE_COPY) {
    pAVar4 = (((this->m_queryPoolResultsBuffer).m_ptr)->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    submitInfoReset._0_8_ = &PTR__Allocation_00c234b8;
    submitInfoReset.pNext = (void *)(pAVar4->m_memory).m_internal;
    submitInfoReset._16_8_ = pAVar4->m_offset;
    __src = (VkSemaphore *)pAVar4->m_hostPtr;
    submitInfoReset.pWaitSemaphores = __src;
    ::vk::invalidateMappedMemoryRange
              (vkd,device,(VkDeviceMemory)submitInfoReset.pNext,submitInfoReset._16_8_,
               (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    memcpy(resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,__src,
           (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    ::vk::Allocation::~Allocation((Allocation *)&submitInfoReset);
    this = local_288;
  }
  else if (OVar8 == RESULTS_MODE_GET) {
    VVar7 = (*vkd->_vptr_DeviceInterface[0x20])
                      (vkd,device,(this->m_queryPool).m_internal,0,3,
                       (long)resultsBuffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)resultsBuffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       resultsBuffer.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,(this->m_testVector).queryResultsStride,
                       (ulong)this->m_queryResultFlags);
    if ((local_27c != WAIT_NONE) && (VVar7 == VK_NOT_READY)) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,
                 "getQueryPoolResults returned VK_NOT_READY, but results should be already available."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                 ,0x373);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    ::vk::checkResult(VVar7,"queryResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x377);
  }
  OVar2 = (this->m_testVector).queryResultSize;
  __n = (size_t)OVar2;
  bVar17 = (this->m_testVector).queryResultsAvailability;
  VVar5 = (this->m_testVector).queryResultsStride;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    if (OVar2 == RESULT_SIZE_64_BIT) {
      queryResults[lVar13] =
           *(deUint64 *)
            resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      if ((bVar17 & 1U) != 0) {
        dVar14 = *(deUint64 *)
                  ((long)resultsBuffer.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 8);
        goto LAB_0068dbc0;
      }
    }
    else {
      if (OVar2 != RESULT_SIZE_32_BIT) {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Wrong m_testVector.queryResultSize",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                   ,0x39f);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      queryResults[lVar13] =
           (ulong)(uint)*(deUint64 *)
                         resultsBuffer.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      if ((bVar17 & 1U) != 0) {
        dVar14 = (deUint64)
                 *(uint *)((long)resultsBuffer.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4);
LAB_0068dbc0:
        queryAvailability[lVar13] = dVar14;
      }
    }
    resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)resultsBuffer.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + VVar5);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resultsBuffer,"OcclusionQueryResults",&local_291);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Occlusion query results",&local_292);
  tcu::LogSection::LogSection((LogSection *)&submitInfoReset,(string *)&resultsBuffer,&local_68);
  tcu::LogSection::write((LogSection *)&submitInfoReset,(int)this_01,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)&submitInfoReset);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&resultsBuffer);
  local_290 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar1 = &submitInfoReset.pNext;
  value = queryAvailability;
  pdVar12 = queryResults;
  this_00 = &submitInfoReset.pNext;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    if ((local_288->m_testVector).queryResultsAvailability == false) {
      submitInfoReset._0_8_ = local_290;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"query[ slot == ");
      std::ostream::operator<<(ppvVar1,(int)lVar13);
      std::operator<<((ostream *)ppvVar1,"] result == ");
      pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&submitInfoReset,pdVar12);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      submitInfoReset._0_8_ = local_290;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"query[ slot == ");
      std::ostream::operator<<(this_00,(int)lVar13);
      std::operator<<((ostream *)this_00,"] result == ");
      pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&submitInfoReset,pdVar12);
      std::operator<<((ostream *)&pMVar10->m_str,", availability\t== ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&submitInfoReset.pNext);
    value = value + 1;
    pdVar12 = pdVar12 + 1;
  }
  VVar3 = (local_288->m_testVector).primitiveTopology;
  local_290 = ((local_288->super_TestInstance).m_context)->m_testCtx->m_log;
  bVar17 = true;
  pdVar12 = queryResults;
  lVar13 = 0;
  do {
    if (lVar13 == 3) {
      tcu::TestLog::endSection(this_01);
      if ((local_288->m_testVector).queryResultsMode != RESULTS_MODE_COPY) {
        VVar7 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar9);
        ::vk::checkResult(VVar7,"vk.queueWaitIdle(queue)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                          ,0x2d9);
      }
      if (bVar17) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&submitInfoReset,"Query result verification passed",
                   (allocator<char> *)&resultsBuffer);
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->m_description,(string *)&submitInfoReset);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&submitInfoReset,"Query result verification failed",
                   (allocator<char> *)&resultsBuffer);
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->m_description,(string *)&submitInfoReset);
      }
      std::__cxx11::string::~string((string *)&submitInfoReset);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return __return_storage_ptr__;
    }
    iVar15 = (int)lVar13;
    if (((local_288->m_testVector).queryResultsAvailability == true) &&
       (queryAvailability[lVar13] == 0)) {
      if (local_27c == WAIT_NONE) {
LAB_0068de31:
        uStack_2a0 = 0;
        uVar16 = 0;
        goto LAB_0068de3e;
      }
      submitInfoReset._0_8_ = local_290;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&submitInfoReset.pNext);
      ppvVar1 = &submitInfoReset.pNext;
      std::operator<<((ostream *)ppvVar1,"query results availability was 0 for index ");
      std::ostream::operator<<(ppvVar1,iVar15);
      std::operator<<((ostream *)ppvVar1,", expected any value greater than 0.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
LAB_0068e04d:
      bVar17 = false;
    }
    else {
      if (VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        uVar16 = 0x7c2;
        if (lVar13 == 2) {
          uVar16 = 0;
        }
        uStack_2a0 = 0x83d;
        if (lVar13 == 2) {
          uStack_2a0 = 0;
        }
      }
      else {
        if (VVar3 != VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,"Unsupported primitive topology",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                     ,0x3f4);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (iVar15 == 0) {
          uStack_2a0 = 3;
          uVar16 = uStack_2a0;
        }
        else {
          if (iVar15 != 1) goto LAB_0068de31;
          uStack_2a0 = 1;
          uVar16 = uStack_2a0;
        }
      }
LAB_0068de3e:
      uVar6 = *pdVar12;
      if ((uStack_2a0 == 0 && uVar16 == 0) ||
         (((local_288->m_testVector).queryControlFlags & 1) != 0)) {
        if (uVar6 < uVar16 || uStack_2a0 < uVar6) {
          submitInfoReset._0_8_ = local_290;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&submitInfoReset.pNext);
          ppvVar1 = &submitInfoReset.pNext;
          std::operator<<((ostream *)ppvVar1,"wrong value of query for index ");
          std::ostream::operator<<(ppvVar1,iVar15);
          std::operator<<((ostream *)ppvVar1,", expected the value minimum of ");
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar1);
          std::operator<<((ostream *)ppvVar1,", maximum of ");
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar1);
          std::operator<<((ostream *)ppvVar1," got ");
          pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&submitInfoReset,pdVar12);
          std::operator<<((ostream *)&pMVar10->m_str,".");
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
          goto LAB_0068e04d;
        }
      }
      else if (uVar6 == 0) {
        submitInfoReset._0_8_ = local_290;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&submitInfoReset.pNext);
        std::operator<<((ostream *)&submitInfoReset.pNext,"wrong value of query for index ");
        std::ostream::operator<<(&submitInfoReset.pNext,iVar15);
        std::operator<<((ostream *)&submitInfoReset.pNext,", expected any non-zero value, got ");
        pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&submitInfoReset,pdVar12);
        std::operator<<((ostream *)&pMVar10->m_str,".");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&submitInfoReset.pNext);
        goto LAB_0068e04d;
      }
    }
    lVar13 = lVar13 + 1;
    pdVar12 = pdVar12 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus OcclusionQueryTestInstance::iterate (void)
{
	const vk::VkQueue			queue		= m_context.getUniversalQueue();
	const vk::DeviceInterface&	vk			= m_context.getDeviceInterface();
	tcu::TestLog&				log			= m_context.getTestContext().getLog();
	std::vector<tcu::Vec4>		vertices	(NUM_VERTICES);

	// 1st triangle
	vertices[START_VERTEX + 0] = tcu::Vec4( 0.5,  0.5, 0.5, 1.0);
	vertices[START_VERTEX + 1] = tcu::Vec4( 0.5, -0.5, 0.5, 1.0);
	vertices[START_VERTEX + 2] = tcu::Vec4(-0.5,  0.5, 0.5, 1.0);
	// 2nd triangle - partially occluding the scene
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 0] = tcu::Vec4(-0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);
	// 3nd triangle - fully occluding the scene
	vertices[START_VERTEX_OCCLUDER + 0] = tcu::Vec4( 0.5,  0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);

	m_stateObjects->setVertices(vk, vertices);

	if (hasSeparateResetCmdBuf())
	{
		const vk::VkSubmitInfo		submitInfoReset =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// deUint32					waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,											// deUint32					commandBufferCount;
			&m_queryPoolResetCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0u,											// deUint32					signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*		pSignalSemaphores;
		};

		vk.queueSubmit(queue, 1, &submitInfoReset, DE_NULL);

		// Trivially wait for reset to complete. This is to ensure the query pool is in reset state before
		// host accesses, so as to not insert any synchronization before capturing the results needed for WAIT_NONE
		// variant of test.
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	{
		const vk::VkSubmitInfo submitInfoRender =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_renderCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfoRender, DE_NULL);
	}

	if (m_testVector.queryWait == WAIT_QUEUE)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	if (hasSeparateCopyCmdBuf())
	{
		// In case of WAIT_QUEUE test variant, the previously submitted m_renderCommandBuffer did not
		// contain vkCmdCopyQueryResults, so additional cmd buffer is needed.

		// In the case of WAIT_NONE or WAIT_QUERY, vkCmdCopyQueryResults is stored in m_renderCommandBuffer.

		const vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_copyResultsCommandBuffer.get(),	// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);
	}

	if (m_testVector.queryResultsMode == RESULTS_MODE_COPY)
	{
		// In case of vkCmdCopyQueryResults is used, test must always wait for it
		// to complete before we can read the result buffer.

		VK_CHECK(vk.queueWaitIdle(queue));
	}

	deUint64 queryResults		[NUM_QUERIES_IN_POOL];
	deUint64 queryAvailability	[NUM_QUERIES_IN_POOL];

	// Allow not ready results only if nobody waited before getting the query results
	bool	allowNotReady		= (m_testVector.queryWait == WAIT_NONE);

	captureResults(queryResults, queryAvailability, allowNotReady);

	log << tcu::TestLog::Section("OcclusionQueryResults", "Occlusion query results");

	logResults(queryResults, queryAvailability);
	bool passed = validateResults(queryResults, queryAvailability, allowNotReady, m_testVector.primitiveTopology);

	log << tcu::TestLog::EndSection;

	if (m_testVector.queryResultsMode != RESULTS_MODE_COPY)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

		if (passed)
	{
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Query result verification passed");
	}
	return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Query result verification failed");
}